

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void disas_simd_three_reg_same_fp16(DisasContext_conflict1 *s,uint32_t insn)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uintptr_t o;
  TCGTemp *pTVar5;
  TCGv_i64 pTVar6;
  TCGTemp *pTVar7;
  TCGv_i32 pTVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uintptr_t o_11;
  TCGContext_conflict1 *pTVar14;
  TCGContext_conflict1 *pTVar15;
  ulong uVar16;
  TCGContext_conflict1 *pTVar17;
  uintptr_t o_12;
  TCGArg TVar18;
  TCGArg a3;
  code *pcVar19;
  uint64_t pc;
  DisasContext_conflict1 *s_00;
  uint32_t target_el;
  uint uVar20;
  uintptr_t o_5;
  ulong uVar21;
  TCGv_i32 pTVar22;
  uint uVar23;
  TCGContext_conflict1 *pTVar24;
  long lVar25;
  DisasContext_conflict1 *pDVar26;
  uintptr_t o_10;
  uintptr_t o_9;
  TCGv_i32 tcg_res [8];
  int in_stack_fffffffffffffe48;
  TCGTemp *pTStack_1b0;
  TCGv_i64 pTStack_1a8;
  long lStack_1a0;
  TCGContext_conflict1 *pTStack_198;
  TCGv_i64 pTStack_190;
  TCGv_i64 pTStack_188;
  TCGArg TStack_180;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  TCGv_i32 pTStack_168;
  DisasContext_conflict1 *pDStack_160;
  ulong uStack_158;
  ulong uStack_150;
  TCGContext_conflict1 *pTStack_148;
  TCGTemp *pTStack_140;
  DisasContext_conflict1 *pDStack_138;
  TCGContext_conflict1 *pTStack_130;
  TCGContext_conflict1 *pTStack_128;
  TCGTemp *pTStack_120;
  TCGv_i64 local_110;
  long local_108;
  TCGContext_conflict1 *local_100;
  TCGTemp *local_f8;
  long local_f0;
  TCGv_i64 local_e8;
  TCGv_i64 local_e0;
  DisasContext_conflict1 *local_b0;
  uint local_a4;
  ulong local_a0;
  TCGTemp *local_98;
  TCGTemp *local_90;
  TCGv_i64 local_88;
  TCGv_i64 local_78;
  TCGTemp *local_70;
  TCGTemp *local_68;
  ulong local_60;
  uint32_t local_54;
  TCGContext_conflict1 *local_50;
  ulong local_48;
  ulong local_40;
  TCGv_i64 local_38;
  
  if ((s->isar->id_aa64pfr0 & 0xf0000) != 0x10000) {
    unallocated_encoding_aarch64(s);
    return;
  }
  if (s->fp_access_checked == true) {
    pTStack_120 = (TCGTemp *)0x6b2eff;
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  pTVar17 = s->uc->tcg_ctx;
  s->fp_access_checked = true;
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
    return;
  }
  local_60 = (ulong)(insn >> 0x10 & 0x1f);
  local_50 = (TCGContext_conflict1 *)(ulong)(insn >> 5 & 0x1f);
  local_a4 = insn & 0x1f;
  uVar23 = insn >> 0x14 & 8 | insn >> 0xb & 7;
  uVar20 = insn >> 0x19 & 0x10;
  uVar12 = insn >> 0x1c & 4;
  uVar9 = (uVar20 + uVar23) - 0x10;
  uVar10 = uVar9 >> 1;
  uVar9 = uVar10 | (uint)((uVar9 & 1) != 0) << 0x1f;
  uVar13 = uVar12 + 4;
  local_108 = CONCAT71(local_108._1_7_,uVar9 < 8);
  local_a0 = CONCAT44(local_a0._4_4_,uVar9);
  local_110 = (TCGv_i64)CONCAT71(local_110._1_7_,0x9b >> ((byte)uVar10 & 0x1f));
  uVar10 = 0;
  pTStack_120 = (TCGTemp *)0x6b24b4;
  local_b0 = s;
  pTVar5 = tcg_temp_new_internal_aarch64(pTVar17,TCG_TYPE_I64,false);
  pTVar6 = (TCGv_i64)((long)pTVar5 - (long)pTVar17);
  pTStack_120 = (TCGTemp *)0x6b24d6;
  local_100 = pTVar17;
  tcg_gen_addi_i64_aarch64(pTVar17,pTVar6,(TCGv_i64)pTVar17->cpu_env,0x2ed0);
  pTVar17 = local_100;
  local_54 = insn;
  local_38 = pTVar6;
  if (((byte)local_108 & (byte)local_110) == 0) {
    local_40 = (ulong)(uVar23 | uVar20);
    local_110 = (TCGv_i64)((long)local_100 + (long)pTVar6);
    local_a0 = (ulong)(local_a4 * 0x100 + 0xc10);
    local_48 = (ulong)uVar13;
    TVar18 = (ulong)(uint)((int)local_60 << 8) + 0xc10;
    pTVar24 = (TCGContext_conflict1 *)((ulong)(uint)((int)local_50 << 8) + 0xc10);
    pDVar26 = local_b0;
    do {
      pTStack_120 = (TCGTemp *)0x6b2896;
      local_60 = TVar18;
      pTVar5 = tcg_temp_new_internal_aarch64(pTVar17,TCG_TYPE_I32,false);
      pTVar14 = (TCGContext_conflict1 *)((long)pTVar5 - (long)pTVar17);
      pTStack_120 = (TCGTemp *)0x6b28a8;
      pTVar5 = tcg_temp_new_internal_aarch64(pTVar17,TCG_TYPE_I32,false);
      pTStack_120 = (TCGTemp *)0x6b28ba;
      pTVar7 = tcg_temp_new_internal_aarch64(pTVar17,TCG_TYPE_I32,false);
      pTVar15 = pDVar26->uc->tcg_ctx;
      pTStack_120 = (TCGTemp *)0x6b28f3;
      local_100 = pTVar14;
      local_50 = pTVar24;
      tcg_gen_op3_aarch64(pTVar15,INDEX_op_ld16u_i32,(long)pTVar15 + (long)pTVar14,
                          (TCGArg)(pTVar15->cpu_env + (long)pTVar15),(TCGArg)pTVar24);
      pTVar15 = pDVar26->uc->tcg_ctx;
      pTStack_120 = (TCGTemp *)0x6b2929;
      local_108 = (long)pTVar5 - (long)pTVar17;
      tcg_gen_op3_aarch64(pTVar15,INDEX_op_ld16u_i32,(long)pTVar15 + ((long)pTVar5 - (long)pTVar17),
                          (TCGArg)(pTVar15->cpu_env + (long)pTVar15),local_60);
      pTVar15 = local_100;
      lVar25 = local_108;
      pTVar5 = pTVar7;
      if (0x1d < (uint)local_40) {
switchD_006b2950_caseD_5:
        uVar21 = (ulong)local_54;
        pTStack_120 = (TCGTemp *)disas_simd_two_reg_misc_fp16;
        s_00 = local_b0;
        disas_simd_three_reg_same_fp16_cold_1();
        pTStack_128 = pTVar17;
        pTStack_148 = pTVar14;
        pTStack_140 = pTVar5;
        pDStack_138 = pDVar26;
        pTStack_130 = pTVar24;
        pTStack_120 = pTVar7;
        if ((s_00->isar->id_aa64pfr0 & 0xf0000) != 0x10000) goto LAB_006b30d5;
        uVar9 = (uint)uVar21;
        uVar16 = uVar21 & 0xffffffff;
        pTVar17 = s_00->uc->tcg_ctx;
        uVar12 = (uint)(uVar21 >> 0x1d) & 1;
        uVar10 = (uint)(uVar21 >> 0x12) & 0x20 | (uint)(uVar21 >> 0xc) & 0x1f;
        iVar11 = uVar12 * 0x40;
        uVar20 = iVar11 + uVar10;
        uVar23 = uVar9 & 0x1f;
        uVar13 = (uint)(uVar21 >> 5) & 0x1f;
        bVar3 = 1;
        iVar4 = 0xd830b4;
        bVar1 = false;
        bVar2 = false;
        switch(uVar10 + iVar11) {
        case 0x18:
          iVar4 = 0;
          break;
        case 0x19:
          iVar4 = 2;
          break;
        case 0x1a:
switchD_006b2fa2_caseD_1a:
          iVar4 = 0;
          bVar2 = true;
          bVar3 = 1;
          goto LAB_006b303a;
        case 0x1b:
switchD_006b2fa2_caseD_1b:
          iVar4 = 2;
          goto LAB_006b3046;
        case 0x1c:
switchD_006b2fa2_caseD_1c:
          iVar4 = 4;
          goto LAB_006b3046;
        case 0x1d:
switchD_006b2fa2_caseD_1d:
          iVar4 = 1;
          if ((uVar21 & 0x10000000) == 0) {
            iVar4 = ((uint)(uVar16 >> 0x1c) & 4) + 4;
          }
          if (s_00->fp_access_checked == true) goto LAB_006b371a;
          s_00->fp_access_checked = true;
          target_el = s_00->fp_excp_el;
          if (target_el == 0) {
            handle_simd_intfp_conv(s_00,uVar23,uVar13,iVar4,uVar12 ^ 1,0,1);
            return;
          }
          pc = s_00->pc_curr;
          goto LAB_006b311f;
        case 0x1e:
        case 0x1f:
        case 0x20:
        case 0x21:
        case 0x22:
        case 0x23:
        case 0x24:
        case 0x25:
        case 0x26:
        case 0x27:
        case 0x28:
        case 0x29:
        case 0x2a:
        case 0x2b:
        case 0x30:
        case 0x31:
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x35:
        case 0x36:
        case 0x37:
        case 0x3c:
        case 0x3e:
          goto switchD_006b2fa2_caseD_1e;
        case 0x2c:
        case 0x2d:
        case 0x2e:
switchD_006b2fa2_caseD_2c:
          handle_2misc_fcmp_zero
                    (s_00,uVar20,(_Bool)((byte)(uVar21 >> 0x18) >> 4 & 1),
                     (_Bool)((byte)(uVar16 >> 0x1e) & 1),true,uVar13,uVar23,
                     in_stack_fffffffffffffe48);
          return;
        case 0x2f:
switchD_006b2fa2_caseD_2f:
          bVar2 = false;
          bVar3 = 0;
LAB_006b303a:
          bVar1 = false;
          goto switchD_006b2fa2_caseD_3d;
        case 0x38:
          iVar4 = 1;
          break;
        case 0x39:
          iVar4 = 3;
          break;
        case 0x3a:
switchD_006b2fa2_caseD_3a:
          iVar4 = 1;
          goto LAB_006b3046;
        case 0x3b:
switchD_006b2fa2_caseD_3b:
          iVar4 = 3;
LAB_006b3046:
          bVar2 = true;
          bVar1 = false;
          bVar3 = 1;
        case 0x3d:
        case 0x3f:
          goto switchD_006b2fa2_caseD_3d;
        default:
          iVar4 = 0xd8316c;
          bVar1 = false;
          bVar2 = false;
          switch(uVar20) {
          case 0x6c:
          case 0x6d:
            goto switchD_006b2fa2_caseD_2c;
          case 0x6f:
            goto switchD_006b2fa2_caseD_2f;
          case 0x79:
switchD_006b2fc4_caseD_79:
            bVar2 = false;
            goto LAB_006b30c3;
          case 0x7a:
            goto switchD_006b2fa2_caseD_3a;
          case 0x7b:
            goto switchD_006b2fa2_caseD_3b;
          case 0x7d:
          case 0x7f:
            goto switchD_006b2fa2_caseD_3d;
          default:
            iVar4 = iVar11;
            switch(uVar20) {
            case 0x58:
              iVar4 = 4;
              goto LAB_006b30be;
            case 0x59:
              goto switchD_006b2fc4_caseD_79;
            case 0x5a:
              goto switchD_006b2fa2_caseD_1a;
            case 0x5b:
              goto switchD_006b2fa2_caseD_1b;
            case 0x5c:
              goto switchD_006b2fa2_caseD_1c;
            case 0x5d:
              goto switchD_006b2fa2_caseD_1d;
            }
          case 0x6e:
          case 0x70:
          case 0x71:
          case 0x72:
          case 0x73:
          case 0x74:
          case 0x75:
          case 0x76:
          case 0x77:
          case 0x78:
          case 0x7c:
          case 0x7e:
switchD_006b2fa2_caseD_1e:
            disas_simd_two_reg_misc_fp16_cold_1();
          }
          goto LAB_006b3756;
        }
LAB_006b30be:
        bVar2 = true;
LAB_006b30c3:
        bVar3 = 1;
        bVar1 = true;
switchD_006b2fa2_caseD_3d:
        if (((uVar9 >> 0x1c & 1) != 0) && (((uVar9 >> 0x1e & 1) == 0 || (bVar1)))) {
LAB_006b30d5:
          unallocated_encoding_aarch64(s_00);
          return;
        }
        if (s_00->fp_access_checked == true) {
LAB_006b371a:
          __assert_fail("!s->fp_access_checked",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                        ,0x487,"_Bool fp_access_check(DisasContext *)");
        }
        s_00->fp_access_checked = true;
        target_el = s_00->fp_excp_el;
        if (target_el != 0) {
          pc = s_00->pc_curr;
LAB_006b311f:
          gen_exception_insn(s_00,pc,1,0x1fe0000a,target_el);
          return;
        }
        pTStack_198 = pTVar17;
        TStack_180 = (ulong)uVar13;
        if ((bool)(bVar3 | bVar2)) {
          lStack_1a0 = CONCAT44(lStack_1a0._4_4_,iVar4);
          pTVar5 = tcg_temp_new_internal_aarch64(pTVar17,TCG_TYPE_I64,false);
          pTStack_188 = (TCGv_i64)((long)pTVar5 - (long)pTVar17);
          tcg_gen_addi_i64_aarch64(pTVar17,pTStack_188,(TCGv_i64)pTVar17->cpu_env,0x2ed0);
          iVar4 = (int)lStack_1a0;
        }
        else {
          pTStack_188 = (TCGv_i64)0x0;
        }
        if (bVar2) {
          iVar4 = arm_rmode_to_sf_aarch64(iVar4);
          pTVar17 = pTStack_198;
          pTStack_168 = tcg_const_i32_aarch64(pTStack_198,iVar4);
          pTStack_1b0 = (TCGTemp *)(pTStack_168 + (long)pTVar17);
          pTStack_1a8 = pTStack_188 + (long)pTVar17;
          tcg_gen_callN_aarch64(pTVar17,helper_set_rmode_aarch64,pTStack_1b0,2,&pTStack_1b0);
        }
        else {
          pTStack_168 = (TCGv_i32)0x0;
        }
        pDStack_160 = s_00;
        if ((uVar9 >> 0x1c & 1) == 0) {
          lVar25 = (ulong)((uint)(uVar16 >> 0x1c) & 4) + 4;
          pTStack_190 = pTStack_188 + (long)pTStack_198;
          a3 = (TCGArg)(uVar23 * 0x100 + 0xc10);
          TVar18 = (ulong)(uint)((int)TStack_180 << 8) + 0xc10;
          uStack_150 = (ulong)uVar20;
          uStack_158 = (ulong)(uVar20 - 0x2f);
          uStack_16c = uVar20 - 0x1a;
          uStack_170 = uVar20 - 0x18;
          pTVar17 = pTStack_198;
          uStack_178 = uVar9;
          uStack_174 = uVar23;
          goto LAB_006b32c1;
        }
        pTVar8 = read_fp_hreg(s_00,(int)TStack_180);
        pTVar17 = pTStack_198;
        pTVar5 = tcg_temp_new_internal_aarch64(pTStack_198,TCG_TYPE_I32,false);
        pTVar6 = pTStack_188;
        pTVar22 = (TCGv_i32)((long)pTVar5 - (long)pTVar17);
        uVar21 = (ulong)uVar20;
        if ((ushort)uVar20 < 0x40) {
          if ((0xc0000001c000000U >> (uVar21 & 0x3f) & 1) == 0) {
            if (uVar21 == 0x3d) {
              pcVar19 = helper_recpe_f16_aarch64;
            }
            else {
              if (uVar21 != 0x3f) goto LAB_006b35bf;
              pcVar19 = helper_frecpx_f16_aarch64;
            }
          }
          else {
            pcVar19 = helper_advsimd_f16tosinth_aarch64;
          }
          goto LAB_006b35fe;
        }
LAB_006b35bf:
        uVar21 = (ulong)(uVar20 - 0x5a);
        if (0x23 < uVar20 - 0x5a) {
LAB_006b3756:
          iVar4 = 0x3339;
          goto LAB_006b3745;
        }
        if ((0x300000007U >> (uVar21 & 0x3f) & 1) == 0) {
          if (uVar21 != 0x15) {
            if (uVar21 != 0x23) goto LAB_006b3756;
            pcVar19 = helper_rsqrte_f16_aarch64;
            goto LAB_006b35fe;
          }
          tcg_gen_xori_i32_aarch64(pTVar17,pTVar22,pTVar8,0x8000);
        }
        else {
          pcVar19 = helper_advsimd_f16touinth_aarch64;
LAB_006b35fe:
          pTStack_1a8 = pTStack_188 + (long)&pTVar17->pool_cur;
          pTStack_1b0 = (TCGTemp *)(pTVar8 + (long)&pTVar17->pool_cur);
          tcg_gen_callN_aarch64
                    (pTVar17,pcVar19,(TCGTemp *)((long)pTVar17 + (long)pTVar22),2,&pTStack_1b0);
        }
        tcg_gen_andi_i32_aarch64(pTVar17,pTVar22,pTVar22,0xffff);
        write_fp_sreg(pDStack_160,uVar23,pTVar22);
        tcg_temp_free_internal_aarch64(pTVar17,(TCGTemp *)(pTVar22 + (long)pTVar17));
        tcg_temp_free_internal_aarch64(pTVar17,(TCGTemp *)(pTVar8 + (long)pTVar17));
        goto LAB_006b3649;
      }
      pTVar5 = (TCGTemp *)((long)pTVar7 - (long)pTVar17);
      pTVar24 = pTVar17;
      switch(local_40 & 0xffffffff) {
      case 0:
        pcVar19 = helper_advsimd_maxnumh_aarch64;
        break;
      case 1:
        pTVar24 = local_b0->uc->tcg_ctx;
        pTStack_120 = (TCGTemp *)0x6b2d48;
        tcg_gen_op3_aarch64(pTVar24,INDEX_op_ld16u_i32,(long)pTVar24 + (long)pTVar5,
                            (TCGArg)(pTVar24->cpu_env + (long)pTVar24),local_a0);
        pTVar15 = local_100;
        goto LAB_006b2d4d;
      case 2:
        pcVar19 = helper_advsimd_addh_aarch64;
        break;
      case 3:
        pcVar19 = helper_advsimd_mulxh_aarch64;
        break;
      case 4:
        pcVar19 = helper_advsimd_ceq_f16_aarch64;
        break;
      default:
        goto switchD_006b2950_caseD_5;
      case 6:
        pcVar19 = helper_advsimd_maxh_aarch64;
        break;
      case 7:
        pcVar19 = helper_recpsf_f16_aarch64;
        break;
      case 8:
        pcVar19 = helper_advsimd_minnumh_aarch64;
        break;
      case 9:
        pTStack_120 = (TCGTemp *)0x6b2a87;
        tcg_gen_xori_i32_aarch64(pTVar17,(TCGv_i32)local_100,(TCGv_i32)local_100,0x8000);
        pTVar24 = local_b0->uc->tcg_ctx;
        pTStack_120 = (TCGTemp *)0x6b2ab7;
        tcg_gen_op3_aarch64(pTVar24,INDEX_op_ld16u_i32,(long)pTVar24 + (long)pTVar5,
                            (TCGArg)(pTVar24->cpu_env + (long)pTVar24),local_a0);
LAB_006b2d4d:
        local_e8 = (TCGv_i64)((long)pTVar17 + (long)pTVar5);
        local_e0 = local_110;
        pcVar19 = helper_advsimd_muladdh_aarch64;
        iVar4 = 4;
        goto LAB_006b2df7;
      case 10:
        pcVar19 = helper_advsimd_subh_aarch64;
        break;
      case 0xe:
        pcVar19 = helper_advsimd_minh_aarch64;
        break;
      case 0xf:
        pcVar19 = helper_rsqrtsf_f16_aarch64;
        break;
      case 0x13:
        pcVar19 = helper_advsimd_mulh_aarch64;
        break;
      case 0x14:
        pcVar19 = helper_advsimd_cge_f16_aarch64;
        break;
      case 0x15:
        pcVar19 = helper_advsimd_acge_f16_aarch64;
        break;
      case 0x17:
        pcVar19 = helper_advsimd_divh_aarch64;
        break;
      case 0x1a:
        local_f8 = (TCGTemp *)((long)&local_100->pool_cur + (long)&pTVar17->pool_cur);
        local_f0 = (long)&pTVar17->pool_cur + local_108;
        local_e8 = local_110;
        pTStack_120 = (TCGTemp *)0x6b2baa;
        tcg_gen_callN_aarch64
                  (pTVar17,helper_advsimd_subh_aarch64,(TCGTemp *)((long)pTVar17 + (long)pTVar5),3,
                   &local_f8);
        pTStack_120 = (TCGTemp *)0x6b2bbd;
        tcg_gen_andi_i32_aarch64(pTVar17,(TCGv_i32)pTVar5,(TCGv_i32)pTVar5,0x7fff);
        goto LAB_006b2e01;
      case 0x1c:
        pcVar19 = helper_advsimd_cgt_f16_aarch64;
        break;
      case 0x1d:
        pcVar19 = helper_advsimd_acgt_f16_aarch64;
      }
      local_e8 = local_110;
      iVar4 = 3;
LAB_006b2df7:
      lVar25 = local_108;
      local_f0 = (long)&pTVar17->pool_cur + local_108;
      local_f8 = (TCGTemp *)((long)&pTVar15->pool_cur + (long)&pTVar17->pool_cur);
      pTStack_120 = (TCGTemp *)0x6b2e01;
      tcg_gen_callN_aarch64
                (pTVar17,pcVar19,(TCGTemp *)((long)pTVar17 + (long)pTVar5),iVar4,&local_f8);
LAB_006b2e01:
      uVar21 = local_a0;
      pDVar26 = local_b0;
      pTVar24 = local_b0->uc->tcg_ctx;
      pTStack_120 = (TCGTemp *)0x6b2e34;
      tcg_gen_op3_aarch64(pTVar24,INDEX_op_st16_i32,(long)pTVar24 + (long)pTVar5,
                          (TCGArg)(pTVar24->cpu_env + (long)pTVar24),local_a0);
      pTStack_120 = (TCGTemp *)0x6b2e42;
      tcg_temp_free_internal_aarch64
                (pTVar17,(TCGTemp *)((long)&pTVar17->pool_cur + (long)&pTVar5->field_0x0));
      pTStack_120 = (TCGTemp *)0x6b2e50;
      tcg_temp_free_internal_aarch64
                (pTVar17,(TCGTemp *)((long)&pTVar17->pool_cur + (long)&pTVar15->pool_cur));
      pTStack_120 = (TCGTemp *)0x6b2e5e;
      tcg_temp_free_internal_aarch64(pTVar17,(TCGTemp *)((long)&pTVar17->pool_cur + lVar25));
      TVar18 = local_60 + 2;
      pTVar24 = (TCGContext_conflict1 *)((long)&local_50->pool_cur + 2);
      local_a0 = uVar21 + 2;
      local_48 = local_48 - 1;
    } while (local_48 != 0);
  }
  else {
    pTStack_120 = (TCGTemp *)0x6b2504;
    local_68 = tcg_temp_new_internal_aarch64(local_100,TCG_TYPE_I32,false);
    local_108 = (long)local_68 - (long)pTVar17;
    pTStack_120 = (TCGTemp *)0x6b2520;
    local_70 = tcg_temp_new_internal_aarch64(pTVar17,TCG_TYPE_I32,false);
    local_110 = (TCGv_i64)((long)local_70 - (long)pTVar17);
    local_48 = (ulong)(uVar13 >> 1);
    local_78 = (TCGv_i64)((long)pTVar17 + (long)pTVar6);
    local_40 = CONCAT44(local_40._4_4_,uVar12 + 3);
    uVar21 = 0;
    do {
      pDVar26 = local_b0;
      iVar4 = (int)local_60;
      if (uVar21 < local_48) {
        iVar4 = (int)local_50;
      }
      uVar9 = uVar10 & (uint)local_40;
      pTVar17 = local_b0->uc->tcg_ctx;
      pTStack_120 = (TCGTemp *)0x6b25bb;
      tcg_gen_op3_aarch64(pTVar17,INDEX_op_ld16u_i32,(long)&pTVar17->pool_cur + local_108,
                          (TCGArg)(pTVar17->cpu_env + (long)pTVar17),
                          (ulong)(iVar4 * 0x100 + uVar9 * 2 + 0xc10));
      pTVar17 = pDVar26->uc->tcg_ctx;
      pTStack_120 = (TCGTemp *)0x6b25f1;
      tcg_gen_op3_aarch64(pTVar17,INDEX_op_ld16u_i32,(TCGArg)(local_110 + (long)&pTVar17->pool_cur),
                          (TCGArg)(pTVar17->cpu_env + (long)pTVar17),
                          (ulong)(iVar4 * 0x100 + uVar9 * 2 + 0xc12));
      pTVar17 = local_100;
      pTStack_120 = (TCGTemp *)0x6b2602;
      pTVar5 = tcg_temp_new_internal_aarch64(local_100,TCG_TYPE_I32,false);
      (&local_f8)[uVar21] = (TCGTemp *)((long)pTVar5 - (long)pTVar17);
      switch(local_a0 & 0xffffffff) {
      case 0:
        pcVar19 = helper_advsimd_maxnumh_aarch64;
        break;
      case 1:
        pcVar19 = helper_advsimd_addh_aarch64;
        break;
      default:
        pTStack_120 = (TCGTemp *)0x6b2ee0;
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                   ,0x2e6e,(char *)0x0);
      case 3:
        pcVar19 = helper_advsimd_maxh_aarch64;
        break;
      case 4:
        pcVar19 = helper_advsimd_minnumh_aarch64;
        break;
      case 7:
        pcVar19 = helper_advsimd_minh_aarch64;
      }
      local_88 = local_78;
      local_90 = local_70;
      local_98 = local_68;
      pTStack_120 = (TCGTemp *)0x6b277d;
      tcg_gen_callN_aarch64
                (pTVar17,pcVar19,
                 (TCGTemp *)
                 ((long)&pTVar17->pool_cur +
                 (long)&((TCGTemp *)((long)pTVar5 - (long)pTVar17))->field_0x0),3,&local_98);
      pDVar26 = local_b0;
      pTVar17 = local_100;
      uVar21 = uVar21 + 1;
      uVar10 = uVar10 + 2;
    } while (uVar13 != uVar21);
    TVar18 = (TCGArg)(local_a4 * 0x100 + 0xc10);
    uVar21 = 0;
    do {
      pTVar5 = (&local_f8)[uVar21];
      pTVar24 = pDVar26->uc->tcg_ctx;
      pTStack_120 = (TCGTemp *)0x6b27dc;
      tcg_gen_op3_aarch64(pTVar24,INDEX_op_st16_i32,(long)&pTVar24->pool_cur + (long)pTVar5,
                          (TCGArg)(pTVar24->cpu_env + (long)pTVar24),TVar18);
      pTStack_120 = (TCGTemp *)0x6b27ea;
      tcg_temp_free_internal_aarch64(pTVar17,(TCGTemp *)((long)&pTVar17->pool_cur + (long)pTVar5));
      uVar21 = uVar21 + 1;
      TVar18 = TVar18 + 2;
    } while (uVar13 != uVar21);
    pTStack_120 = (TCGTemp *)0x6b2806;
    tcg_temp_free_internal_aarch64(pTVar17,(TCGTemp *)((long)&pTVar17->pool_cur + local_108));
    pTStack_120 = (TCGTemp *)0x6b2816;
    tcg_temp_free_internal_aarch64(pTVar17,(TCGTemp *)(local_110 + (long)pTVar17));
  }
  uVar10 = local_54 >> 0x1e;
  pTStack_120 = (TCGTemp *)0x6b2ead;
  tcg_temp_free_internal_aarch64(pTVar17,(TCGTemp *)(local_38 + (long)pTVar17));
  pTStack_120 = (TCGTemp *)0x6b2ebb;
  clear_vec_high(pDVar26,(_Bool)((byte)uVar10 & 1),local_a4);
  return;
LAB_006b32c1:
  lStack_1a0 = lVar25;
  pTVar5 = tcg_temp_new_internal_aarch64(pTVar17,TCG_TYPE_I32,false);
  pTVar8 = (TCGv_i32)((long)pTVar5 - (long)pTVar17);
  pTVar5 = tcg_temp_new_internal_aarch64(pTVar17,TCG_TYPE_I32,false);
  pTVar22 = (TCGv_i32)((long)pTVar5 - (long)pTVar17);
  pTVar17 = s_00->uc->tcg_ctx;
  TStack_180 = TVar18;
  tcg_gen_op3_aarch64(pTVar17,INDEX_op_ld16u_i32,(TCGArg)((long)pTVar17 + (long)pTVar8),
                      (TCGArg)(pTVar17->cpu_env + (long)pTVar17),TVar18);
  pTVar17 = pTStack_198;
  iVar4 = (int)uStack_150;
  if (iVar4 < 0x58) {
    if ((uint)uStack_158 < 0xf) {
      (*(code *)(&DAT_00d831bc + *(int *)(&DAT_00d831bc + uStack_158 * 4)))();
      return;
    }
    if (uStack_16c < 3) {
      pcVar19 = helper_advsimd_f16tosinth_aarch64;
    }
    else {
      if (1 < uStack_170) goto switchD_006b3381_caseD_7c;
switchD_006b3381_caseD_79:
      pcVar19 = helper_advsimd_rinth_aarch64;
    }
    goto LAB_006b3469;
  }
  if (iVar4 < 0x6f) {
    if (iVar4 - 0x5aU < 3) goto switchD_006b3381_caseD_7a;
    if (iVar4 == 0x58) goto switchD_006b3381_caseD_79;
    if (iVar4 != 0x59) goto switchD_006b3381_caseD_7c;
    pcVar19 = helper_advsimd_rinth_exact_aarch64;
    goto LAB_006b3469;
  }
  switch(iVar4) {
  case 0x79:
    goto switchD_006b3381_caseD_79;
  case 0x7a:
  case 0x7b:
switchD_006b3381_caseD_7a:
    pcVar19 = helper_advsimd_f16touinth_aarch64;
    break;
  case 0x7c:
  case 0x7e:
switchD_006b3381_caseD_7c:
    iVar4 = 0x3373;
LAB_006b3745:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
               ,iVar4,(char *)0x0);
  case 0x7d:
    pcVar19 = helper_rsqrte_f16_aarch64;
    break;
  case 0x7f:
    pcVar19 = helper_sqrt_f16_aarch64;
    break;
  default:
    if (iVar4 != 0x6f) goto switchD_006b3381_caseD_7c;
    tcg_gen_xori_i32_aarch64(pTStack_198,pTVar22,pTVar8,0x8000);
    goto LAB_006b3478;
  }
LAB_006b3469:
  pTStack_1b0 = (TCGTemp *)((long)pTStack_198 + (long)pTVar8);
  pTStack_1a8 = pTStack_190;
  tcg_gen_callN_aarch64
            (pTStack_198,pcVar19,(TCGTemp *)((long)pTStack_198 + (long)pTVar22),2,&pTStack_1b0);
LAB_006b3478:
  s_00 = pDStack_160;
  lVar25 = lStack_1a0;
  pTVar24 = pDStack_160->uc->tcg_ctx;
  tcg_gen_op3_aarch64(pTVar24,INDEX_op_st16_i32,(TCGArg)((long)pTVar24 + (long)pTVar22),
                      (TCGArg)(pTVar24->cpu_env + (long)pTVar24),a3);
  tcg_temp_free_internal_aarch64(pTVar17,(TCGTemp *)(pTVar22 + (long)pTVar17));
  tcg_temp_free_internal_aarch64(pTVar17,(TCGTemp *)(pTVar8 + (long)pTVar17));
  TVar18 = TStack_180 + 2;
  a3 = a3 + 2;
  lVar25 = lVar25 + -1;
  if (lVar25 == 0) {
    clear_vec_high(s_00,(_Bool)((byte)(uStack_178 >> 0x1e) & 1),uStack_174);
    pTVar6 = pTStack_188;
LAB_006b3649:
    if (pTStack_168 != (TCGv_i32)0x0) {
      pTVar5 = (TCGTemp *)(pTStack_168 + (long)pTVar17);
      pTStack_1a8 = pTVar6 + (long)&pTVar17->pool_cur;
      pTStack_1b0 = pTVar5;
      tcg_gen_callN_aarch64(pTVar17,helper_set_rmode_aarch64,pTVar5,2,&pTStack_1b0);
      tcg_temp_free_internal_aarch64(pTVar17,pTVar5);
    }
    if (pTVar6 != (TCGv_i64)0x0) {
      tcg_temp_free_internal_aarch64(pTVar17,(TCGTemp *)(pTVar6 + (long)pTVar17));
    }
    return;
  }
  goto LAB_006b32c1;
}

Assistant:

static void disas_simd_three_reg_same_fp16(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opcode, fpopcode;
    int is_q, u, a, rm, rn, rd;
    int datasize, elements;
    int pass;
    TCGv_ptr fpst;
    bool pairwise = false;

    if (!dc_isar_feature(aa64_fp16, s)) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    /* For these floating point ops, the U, a and opcode bits
     * together indicate the operation.
     */
    opcode = extract32(insn, 11, 3);
    u = extract32(insn, 29, 1);
    a = extract32(insn, 23, 1);
    is_q = extract32(insn, 30, 1);
    rm = extract32(insn, 16, 5);
    rn = extract32(insn, 5, 5);
    rd = extract32(insn, 0, 5);

    fpopcode = opcode | (a << 3) |  (u << 4);
    datasize = is_q ? 128 : 64;
    elements = datasize / 16;

    switch (fpopcode) {
    case 0x10: /* FMAXNMP */
    case 0x12: /* FADDP */
    case 0x16: /* FMAXP */
    case 0x18: /* FMINNMP */
    case 0x1e: /* FMINP */
        pairwise = true;
        break;
    }

    fpst = get_fpstatus_ptr(tcg_ctx, true);

    if (pairwise) {
        int maxpass = is_q ? 8 : 4;
        TCGv_i32 tcg_op1 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 tcg_op2 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 tcg_res[8];

        for (pass = 0; pass < maxpass; pass++) {
            int passreg = pass < (maxpass / 2) ? rn : rm;
            int passelt = (pass << 1) & (maxpass - 1);

            read_vec_element_i32(s, tcg_op1, passreg, passelt, MO_16);
            read_vec_element_i32(s, tcg_op2, passreg, passelt + 1, MO_16);
            tcg_res[pass] = tcg_temp_new_i32(tcg_ctx);

            switch (fpopcode) {
            case 0x10: /* FMAXNMP */
                gen_helper_advsimd_maxnumh(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2,
                                           fpst);
                break;
            case 0x12: /* FADDP */
                gen_helper_advsimd_addh(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x16: /* FMAXP */
                gen_helper_advsimd_maxh(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x18: /* FMINNMP */
                gen_helper_advsimd_minnumh(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2,
                                           fpst);
                break;
            case 0x1e: /* FMINP */
                gen_helper_advsimd_minh(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            default:
                g_assert_not_reached();
            }
        }

        for (pass = 0; pass < maxpass; pass++) {
            write_vec_element_i32(s, tcg_res[pass], rd, pass, MO_16);
            tcg_temp_free_i32(tcg_ctx, tcg_res[pass]);
        }

        tcg_temp_free_i32(tcg_ctx, tcg_op1);
        tcg_temp_free_i32(tcg_ctx, tcg_op2);

    } else {
        for (pass = 0; pass < elements; pass++) {
            TCGv_i32 tcg_op1 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 tcg_op2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 tcg_res = tcg_temp_new_i32(tcg_ctx);

            read_vec_element_i32(s, tcg_op1, rn, pass, MO_16);
            read_vec_element_i32(s, tcg_op2, rm, pass, MO_16);

            switch (fpopcode) {
            case 0x0: /* FMAXNM */
                gen_helper_advsimd_maxnumh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x1: /* FMLA */
                read_vec_element_i32(s, tcg_res, rd, pass, MO_16);
                gen_helper_advsimd_muladdh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, tcg_res,
                                           fpst);
                break;
            case 0x2: /* FADD */
                gen_helper_advsimd_addh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x3: /* FMULX */
                gen_helper_advsimd_mulxh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x4: /* FCMEQ */
                gen_helper_advsimd_ceq_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x6: /* FMAX */
                gen_helper_advsimd_maxh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x7: /* FRECPS */
                gen_helper_recpsf_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x8: /* FMINNM */
                gen_helper_advsimd_minnumh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x9: /* FMLS */
                /* As usual for ARM, separate negation for fused multiply-add */
                tcg_gen_xori_i32(tcg_ctx, tcg_op1, tcg_op1, 0x8000);
                read_vec_element_i32(s, tcg_res, rd, pass, MO_16);
                gen_helper_advsimd_muladdh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, tcg_res,
                                           fpst);
                break;
            case 0xa: /* FSUB */
                gen_helper_advsimd_subh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0xe: /* FMIN */
                gen_helper_advsimd_minh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0xf: /* FRSQRTS */
                gen_helper_rsqrtsf_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x13: /* FMUL */
                gen_helper_advsimd_mulh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x14: /* FCMGE */
                gen_helper_advsimd_cge_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x15: /* FACGE */
                gen_helper_advsimd_acge_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x17: /* FDIV */
                gen_helper_advsimd_divh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x1a: /* FABD */
                gen_helper_advsimd_subh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                tcg_gen_andi_i32(tcg_ctx, tcg_res, tcg_res, 0x7fff);
                break;
            case 0x1c: /* FCMGT */
                gen_helper_advsimd_cgt_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            case 0x1d: /* FACGT */
                gen_helper_advsimd_acgt_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
                break;
            default:
                fprintf(stderr, "%s: insn %#04x, fpop %#2x @ %#" PRIx64 "\n",
                        __func__, insn, fpopcode, s->pc_curr);
                g_assert_not_reached();
            }

            write_vec_element_i32(s, tcg_res, rd, pass, MO_16);
            tcg_temp_free_i32(tcg_ctx, tcg_res);
            tcg_temp_free_i32(tcg_ctx, tcg_op1);
            tcg_temp_free_i32(tcg_ctx, tcg_op2);
        }
    }

    tcg_temp_free_ptr(tcg_ctx, fpst);

    clear_vec_high(s, is_q, rd);
}